

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffpktp(fitsfile *fptr,char *filename,int *status)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  size_t sVar3;
  int *in_RDX;
  char *in_RSI;
  size_t slen;
  int keytype;
  char newname [75];
  char keyname [75];
  char template [161];
  char card [81];
  FILE *diskfile;
  uint in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe24;
  char *in_stack_fffffffffffffe28;
  undefined1 in_stack_fffffffffffffe30;
  undefined7 in_stack_fffffffffffffe31;
  fitsfile *in_stack_fffffffffffffe38;
  char local_188 [8];
  undefined1 local_180;
  int *in_stack_fffffffffffffe88;
  char *in_stack_fffffffffffffe90;
  fitsfile *in_stack_fffffffffffffe98;
  char acStack_139 [73];
  int *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  fitsfile *in_stack_ffffffffffffff28;
  char local_88 [40];
  char acStack_60 [40];
  int *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  int local_4;
  
  if (*in_RDX < 1) {
    __stream = fopen64(in_RSI,"r");
    if (__stream == (FILE *)0x0) {
      ffpmsg((char *)0x250de5);
      ffpmsg((char *)0x250df2);
      *in_RDX = 0x68;
      local_4 = 0x68;
    }
    else {
      while (pcVar2 = fgets(acStack_139 + 1,0xa0,__stream), pcVar2 != (char *)0x0) {
        sVar3 = strlen(acStack_139 + 1);
        acStack_139[sVar3] = '\0';
        iVar1 = ffgthd((char *)keyname._8_8_,(char *)keyname._0_8_,stack0x00000058,
                       (int *)newname._64_8_);
        if (0 < iVar1) break;
        strncpy(local_188,local_88,8);
        local_180 = 0;
        if (in_stack_fffffffffffffe24 == -2) {
          strncpy(&stack0xfffffffffffffe28,acStack_60,8);
          in_stack_fffffffffffffe30 = 0;
          ffmnam(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                 in_stack_ffffffffffffff10);
        }
        else if (in_stack_fffffffffffffe24 == -1) {
          ffdkey((fitsfile *)__stream,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
        }
        else if (in_stack_fffffffffffffe24 == 0) {
          ffucrd(in_stack_fffffffffffffe38,
                 (char *)CONCAT71(in_stack_fffffffffffffe31,in_stack_fffffffffffffe30),
                 in_stack_fffffffffffffe28,(int *)(ulong)in_stack_fffffffffffffe20);
        }
        else {
          if (in_stack_fffffffffffffe24 != 1) break;
          ffprec(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
        }
      }
      fclose(__stream);
      local_4 = *in_RDX;
    }
  }
  else {
    local_4 = *in_RDX;
  }
  return local_4;
}

Assistant:

int ffpktp(fitsfile *fptr,       /* I - FITS file pointer       */
           const char *filename, /* I - name of template file   */
           int *status)          /* IO - error status           */
/*
  read keywords from template file and append to the FITS file
*/
{
    FILE *diskfile;
    char card[FLEN_CARD], template[161];
    char keyname[FLEN_KEYWORD], newname[FLEN_KEYWORD];
    int keytype;
    size_t slen;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    diskfile = fopen(filename,"r"); 
    if (!diskfile)          /* couldn't open file */
    {
            ffpmsg("ffpktp could not open the following template file:");
            ffpmsg(filename);
            return(*status = FILE_NOT_OPENED); 
    }

    while (fgets(template, 160, diskfile) )  /* get next template line */
    {
      template[160] = '\0';      /* make sure string is terminated */
      slen = strlen(template);   /* get string length */
      template[slen - 1] = '\0';  /* over write the 'newline' char */

      if (ffgthd(template, card, &keytype, status) > 0) /* parse template */
         break;

      strncpy(keyname, card, 8);
      keyname[8] = '\0';

      if (keytype == -2)            /* rename the card */
      {
         strncpy(newname, &card[40], 8);
         newname[8] = '\0';

         ffmnam(fptr, keyname, newname, status); 
      }
      else if (keytype == -1)      /* delete the card */
      {
         ffdkey(fptr, keyname, status);
      }
      else if (keytype == 0)       /* update the card */
      {
         ffucrd(fptr, keyname, card, status);
      }
      else if (keytype == 1)      /* append the card */
      {
         ffprec(fptr, card, status);
      }
      else    /* END card; stop here */
      {
         break; 
      }
    }

    fclose(diskfile);   /* close the template file */
    return(*status);
}